

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

LY_ERR lyxml_parse_identifier(lyxml_ctx *xmlctx,char **start,char **end)

{
  char *pcVar1;
  LY_ERR LVar2;
  uint32_t c;
  char *in;
  size_t parsed;
  uint local_4c;
  char *local_48;
  size_t local_40;
  char **local_38;
  
  pcVar1 = xmlctx->in->current;
  local_48 = pcVar1;
  LVar2 = ly_getutf8(&local_48,&local_4c,&local_40);
  if (LVar2 == LY_SUCCESS) {
    if (((local_4c != 0x5f) && (0x19 < (local_4c & 0xffffffdf) - 0x41)) &&
       (local_4c == 0x37e || 0x1c8f < local_4c - 0x370)) {
      if ((((0xdffff < local_4c - 0x10000) && (0x20d < local_4c - 0xfdf0)) &&
          ((0x4cf < local_4c - 0xf900 &&
           ((0xa7fe < local_4c - 0x3001 && (0x3ef < local_4c - 0x2c00)))))) &&
         ((0x11f < local_4c - 0x2070 &&
          (((local_4c & 0xfffffffe) != 0x200c &&
           (0x23f < local_4c - 0xc0 || (local_4c & 0xffffffdf) == 0xd7)))))) {
        ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,
                "Identifier \"%s\" starts with an invalid character.",(long)local_48 - local_40);
        return LY_EVALID;
      }
    }
    local_38 = end;
    ly_in_skip(xmlctx->in,local_40);
    LVar2 = ly_getutf8(&local_48,&local_4c,&local_40);
    if (LVar2 == LY_SUCCESS) {
      do {
        if (((((0x19 < local_4c - 0x61) && (local_4c != 0x2d)) && (local_4c != 0x5f)) &&
            ((9 < local_4c - 0x30 && 0x19 < local_4c - 0x41 && (local_4c != 0x2e)))) &&
           ((local_4c != 0xb7 &&
            ((local_4c == 0x37e || 0x1c8f < local_4c - 0x370 &&
             (((0x20d < local_4c - 0xfdf0 &&
               (0x4cf < local_4c - 0xf900 && 0xa7fe < local_4c - 0x3001)) &&
              ((0x3ef < local_4c - 0x2c00 && (1 < local_4c - 0x203f && 0x11f < local_4c - 0x2070))
              && ((0x6f < local_4c - 0x300 && (local_4c & 0xfffffffe) != 0x200c) &&
                 ((local_4c & 0xffffffdf) == 0xd7 || 0x23f < local_4c - 0xc0)))) &&
              0xdffff < local_4c - 0x10000)))))) {
          *start = pcVar1;
          *local_38 = xmlctx->in->current;
          return LY_SUCCESS;
        }
        ly_in_skip(xmlctx->in,local_40);
        LVar2 = ly_getutf8(&local_48,&local_4c,&local_40);
      } while (LVar2 == LY_SUCCESS);
    }
  }
  ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character 0x%hhx.",
          (ulong)(uint)(int)*local_48);
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyxml_parse_identifier(struct lyxml_ctx *xmlctx, const char **start, const char **end)
{
    const char *s, *in;
    uint32_t c;
    size_t parsed;
    LY_ERR rc;

    in = s = xmlctx->in->current;

    /* check NameStartChar (minus colon) */
    LY_CHECK_ERR_RET(ly_getutf8(&in, &c, &parsed),
            LOGVAL(xmlctx->ctx, LY_VCODE_INCHAR, in[0]),
            LY_EVALID);
    LY_CHECK_ERR_RET(!is_xmlqnamestartchar(c),
            LOGVAL(xmlctx->ctx, LYVE_SYNTAX, "Identifier \"%s\" starts with an invalid character.", in - parsed),
            LY_EVALID);

    /* check rest of the identifier */
    do {
        /* move only successfully parsed bytes */
        ly_in_skip(xmlctx->in, parsed);

        rc = ly_getutf8(&in, &c, &parsed);
        LY_CHECK_ERR_RET(rc, LOGVAL(xmlctx->ctx, LY_VCODE_INCHAR, in[0]), LY_EVALID);
    } while (is_xmlqnamechar(c));

    *start = s;
    *end = xmlctx->in->current;
    return LY_SUCCESS;
}